

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_get_server_ports(mg_context *ctx,int size,mg_server_port *ports)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t local_38;
  int local_30;
  int local_2c;
  int cnt;
  int i;
  mg_server_port *ports_local;
  int size_local;
  mg_context *ctx_local;
  
  local_30 = 0;
  if (size < 1) {
    ctx_local._4_4_ = -1;
  }
  else {
    memset(ports,0,(long)size << 5);
    if (ctx == (mg_context *)0x0) {
      ctx_local._4_4_ = -1;
    }
    else if (ctx->listening_sockets == (socket *)0x0) {
      ctx_local._4_4_ = -1;
    }
    else {
      local_2c = 0;
      while( true ) {
        bVar1 = false;
        if (local_2c < size) {
          bVar1 = local_2c < (int)ctx->num_listening_sockets;
        }
        if (!bVar1) break;
        if (ctx->listening_sockets[local_2c].lsa.sa.sa_family == 10) {
          local_38 = ctx->listening_sockets[local_2c].lsa.sin.sin_port;
        }
        else {
          local_38 = ctx->listening_sockets[local_2c].lsa.sin.sin_port;
        }
        uVar2 = ntohs(local_38);
        ports[local_30].port = (uint)uVar2;
        ports[local_30].is_ssl = (uint)ctx->listening_sockets[local_2c].is_ssl;
        ports[local_30].is_redirect = (uint)ctx->listening_sockets[local_2c].ssl_redir;
        if (ctx->listening_sockets[local_2c].lsa.sa.sa_family == 2) {
          ports[local_30].protocol = 1;
          local_30 = local_30 + 1;
        }
        else if (ctx->listening_sockets[local_2c].lsa.sa.sa_family == 10) {
          ports[local_30].protocol = 3;
          local_30 = local_30 + 1;
        }
        local_2c = local_2c + 1;
      }
      ctx_local._4_4_ = local_30;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_get_server_ports(const struct mg_context *ctx,
                    int size,
                    struct mg_server_port *ports)
{
	int i, cnt = 0;

	if (size <= 0) {
		return -1;
	}
	memset(ports, 0, sizeof(*ports) * (size_t)size);
	if (!ctx) {
		return -1;
	}
	if (!ctx->listening_sockets) {
		return -1;
	}

	for (i = 0; (i < size) && (i < (int)ctx->num_listening_sockets); i++) {

		ports[cnt].port =
		    ntohs(USA_IN_PORT_UNSAFE(&(ctx->listening_sockets[i].lsa)));
		ports[cnt].is_ssl = ctx->listening_sockets[i].is_ssl;
		ports[cnt].is_redirect = ctx->listening_sockets[i].ssl_redir;

		if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET) {
			/* IPv4 */
			ports[cnt].protocol = 1;
			cnt++;
		} else if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET6) {
			/* IPv6 */
			ports[cnt].protocol = 3;
			cnt++;
		}
	}

	return cnt;
}